

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-gost3411.c
# Opt level: O2

void p_crypto_hash_gost3411_update(PHashGOST3411 *ctx,puchar *data,psize len)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  ulong __n;
  puint32 len256 [8];
  
  uVar5 = ctx->len[0] >> 3 & 0x1f;
  len256[2] = 0;
  len256[3] = 0;
  len256[4] = 0;
  len256[5] = 0;
  len256[6] = 0;
  len256[7] = 0;
  len256[1] = (puint32)(len >> 0x1d);
  len256[0] = (uint)len * 8;
  pp_crypto_hash_gost3411_sum_256(ctx->len,len256);
  uVar4 = 0;
  if ((uVar5 != 0) && (uVar4 = uVar5, 0x20 - uVar5 <= (uint)len)) {
    __n = (ulong)(0x20 - uVar5);
    memcpy((void *)((long)ctx->buf + (ulong)uVar5),data,__n);
    pp_crypto_hash_gost3411_process(ctx,ctx->buf);
    pp_crypto_hash_gost3411_sum_256(ctx->sum,ctx->buf);
    data = data + __n;
    len = len - __n;
    uVar4 = 0;
  }
  for (; 0x1f < len; len = len - 0x20) {
    uVar1 = *(undefined8 *)data;
    uVar2 = *(undefined8 *)(data + 8);
    uVar3 = *(undefined8 *)(data + 0x18);
    *(undefined8 *)(ctx->buf + 4) = *(undefined8 *)(data + 0x10);
    *(undefined8 *)(ctx->buf + 6) = uVar3;
    *(undefined8 *)ctx->buf = uVar1;
    *(undefined8 *)(ctx->buf + 2) = uVar2;
    pp_crypto_hash_gost3411_process(ctx,ctx->buf);
    pp_crypto_hash_gost3411_sum_256(ctx->sum,ctx->buf);
    data = data + 0x20;
  }
  if (len == 0) {
    return;
  }
  memcpy((void *)((long)ctx->buf + (ulong)uVar4),data,len);
  return;
}

Assistant:

void
p_crypto_hash_gost3411_update (PHashGOST3411	*ctx,
			       const puchar	*data,
			       psize		len)
{
	puint32	left;
	puint32	to_fill;
	puint32	len256[8];

	left = (ctx->len[0] & 0xFF) >> 3;
	to_fill = 32 - left;

	memset (len256, 0, 32);
	len256[0] = (puint32) (len << 3);
	len256[1] = (puint32) (len >> 29);

	pp_crypto_hash_gost3411_sum_256 (ctx->len, len256);

	if (left && (puint32) len >= to_fill) {
		memcpy ((pchar *) ctx->buf + left, data, to_fill);
		pp_crypto_hash_gost3411_swap_bytes (ctx->buf, 8);
		pp_crypto_hash_gost3411_process (ctx, ctx->buf);
		pp_crypto_hash_gost3411_sum_256 (ctx->sum, ctx->buf);

		data += to_fill;
		len -= to_fill;
		left = 0;
	}

	while (len >= 32) {
		memcpy (ctx->buf, data, 32);
		pp_crypto_hash_gost3411_swap_bytes (ctx->buf, 8);
		pp_crypto_hash_gost3411_process (ctx, ctx->buf);
		pp_crypto_hash_gost3411_sum_256 (ctx->sum, ctx->buf);

		data += 32;
		len -= 32;
	}

	if (len > 0)
		memcpy ((pchar *) ctx->buf + left, data, len);
}